

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiLight *pLight)

{
  bool bVar1;
  ValidateDSProcess *this_00;
  
  if (pLight->mType == aiLightSource_UNDEFINED) {
    ReportWarning(this,"aiLight::mType is aiLightSource_UNDEFINED");
  }
  if ((((pLight->mAttenuationConstant == 0.0) && (!NAN(pLight->mAttenuationConstant))) &&
      (pLight->mAttenuationLinear == 0.0)) && (!NAN(pLight->mAttenuationLinear))) {
    if ((pLight->mAttenuationQuadratic == 0.0) && (!NAN(pLight->mAttenuationQuadratic))) {
      ReportWarning(this,"aiLight::mAttenuationXXX - all are zero");
    }
  }
  if (pLight->mAngleInnerCone < pLight->mAngleOuterCone ||
      pLight->mAngleInnerCone == pLight->mAngleOuterCone) {
    bVar1 = aiColor3D::IsBlack(&pLight->mColorDiffuse);
    if (bVar1) {
      bVar1 = aiColor3D::IsBlack(&pLight->mColorAmbient);
      if (bVar1) {
        this_00 = (ValidateDSProcess *)&pLight->mColorSpecular;
        bVar1 = aiColor3D::IsBlack((aiColor3D *)this_00);
        if (bVar1) {
          ReportWarning(this_00,"aiLight::mColorXXX - all are black and won\'t have any influence");
          return;
        }
      }
    }
    return;
  }
  ReportError(this,"aiLight::mAngleInnerCone is larger than aiLight::mAngleOuterCone");
}

Assistant:

void ValidateDSProcess::Validate( const aiLight* pLight)
{
    if (pLight->mType == aiLightSource_UNDEFINED)
        ReportWarning("aiLight::mType is aiLightSource_UNDEFINED");

    if (!pLight->mAttenuationConstant &&
        !pLight->mAttenuationLinear   &&
        !pLight->mAttenuationQuadratic) {
        ReportWarning("aiLight::mAttenuationXXX - all are zero");
    }

    if (pLight->mAngleInnerCone > pLight->mAngleOuterCone)
        ReportError("aiLight::mAngleInnerCone is larger than aiLight::mAngleOuterCone");

    if (pLight->mColorDiffuse.IsBlack() && pLight->mColorAmbient.IsBlack()
        && pLight->mColorSpecular.IsBlack())
    {
        ReportWarning("aiLight::mColorXXX - all are black and won't have any influence");
    }
}